

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool kwssys::SystemTools::IsSubDirectory(string *cSubdir,string *cDir)

{
  __type _Var1;
  string subdir;
  string dir;
  string local_48;
  string local_28;
  
  if (cDir->_M_string_length == 0) {
    _Var1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_48,(string *)cSubdir);
    std::__cxx11::string::string((string *)&local_28,(string *)cDir);
    ConvertToUnixSlashes(&local_48);
    ConvertToUnixSlashes(&local_28);
    if ((local_28._M_string_length == 0 || local_48._M_string_length <= local_28._M_string_length)
       || (local_48._M_dataplus._M_p
           [local_28._M_string_length -
            (local_28._M_dataplus._M_p[local_28._M_string_length - 1] == '/')] != '/')) {
      _Var1 = false;
    }
    else {
      std::__cxx11::string::resize((ulong)&local_48);
      _Var1 = std::operator==(&local_48,&local_28);
    }
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return _Var1;
}

Assistant:

bool SystemTools::IsSubDirectory(const std::string& cSubdir,
                                 const std::string& cDir)
{
  if (cDir.empty()) {
    return false;
  }
  std::string subdir = cSubdir;
  std::string dir = cDir;
  SystemTools::ConvertToUnixSlashes(subdir);
  SystemTools::ConvertToUnixSlashes(dir);
  if (subdir.size() <= dir.size() || dir.empty()) {
    return false;
  }
  bool isRootPath = dir.back() == '/'; // like "/" or "C:/"
  size_t expectedSlashPosition = isRootPath ? dir.size() - 1u : dir.size();
  if (subdir[expectedSlashPosition] != '/') {
    return false;
  }
  subdir.resize(dir.size());
  return SystemTools::ComparePath(subdir, dir);
}